

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

void __thiscall crnlib::dxt1_endpoint_optimizer::compute_selectors_hc(dxt1_endpoint_optimizer *this)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint a;
  uint b;
  uint a_00;
  uint b_00;
  uint uVar5;
  uint uVar6;
  uchar *puVar7;
  long in_RDI;
  uint e23;
  uint e01;
  uint e3;
  uint e2;
  uint e1;
  uint e0;
  color_quad_u8 *c;
  uint iEnd;
  uint i;
  color_quad_u8 c3;
  color_quad_u8 c2;
  color_quad_u8 c1;
  color_quad_u8 c0;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 grow_hint;
  uint in_stack_ffffffffffffff9c;
  vector<unsigned_char> *in_stack_ffffffffffffffa0;
  uint local_1c;
  byte local_f;
  byte local_b;
  
  grow_hint = (undefined1)((uint)in_stack_ffffffffffffff98 >> 0x18);
  vector<crnlib::unique_color>::size((vector<crnlib::unique_color> *)(in_RDI + 0x38));
  vector<unsigned_char>::resize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(bool)grow_hint)
  ;
  if ((*(byte *)(in_RDI + 0x97a) & 1) == 0) {
    dxt1_block::unpack_color
              ((uint16)((ulong)in_RDI >> 0x30),SUB81((ulong)in_RDI >> 0x28,0),(uint)in_RDI);
    dxt1_block::unpack_color
              ((uint16)((ulong)in_RDI >> 0x30),SUB81((ulong)in_RDI >> 0x28,0),(uint)in_RDI);
    uVar3 = ((uint)local_b * 2 + (uint)local_f + (uint)(*(byte *)(in_RDI + 0x979) & 1)) / 3;
    color_quad<unsigned_char,_int>::color_quad
              ((color_quad<unsigned_char,_int> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,0,0x1de18a);
    uVar4 = ((uint)local_f * 2 + (uint)local_b + (uint)(*(byte *)(in_RDI + 0x979) & 1)) / 3;
    color_quad<unsigned_char,_int>::color_quad
              ((color_quad<unsigned_char,_int> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,0,0x1de214);
    local_1c = 0;
    uVar2 = vector<crnlib::unique_color>::size((vector<crnlib::unique_color> *)(in_RDI + 0x38));
    for (; local_1c < uVar2; local_1c = local_1c + 1) {
      vector<crnlib::unique_color>::operator[]
                ((vector<crnlib::unique_color> *)(in_RDI + 0x38),local_1c);
      a = crnlib::color::color_distance
                    (SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x18,0),
                     (color_quad_u8 *)CONCAT44(uVar4,uVar3),
                     (color_quad_u8 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     SUB41((uint)in_stack_ffffffffffffff8c >> 0x18,0));
      b = crnlib::color::color_distance
                    (SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x18,0),
                     (color_quad_u8 *)CONCAT44(uVar4,uVar3),
                     (color_quad_u8 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     SUB41((uint)in_stack_ffffffffffffff8c >> 0x18,0));
      a_00 = crnlib::color::color_distance
                       (SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x18,0),
                        (color_quad_u8 *)CONCAT44(uVar4,uVar3),
                        (color_quad_u8 *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        SUB41((uint)in_stack_ffffffffffffff8c >> 0x18,0));
      b_00 = crnlib::color::color_distance
                       (SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x18,0),
                        (color_quad_u8 *)CONCAT44(uVar4,uVar3),
                        (color_quad_u8 *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        SUB41((uint)in_stack_ffffffffffffff8c >> 0x18,0));
      uVar5 = math::minimum<unsigned_int>(a,b);
      uVar6 = math::minimum<unsigned_int>(a_00,b_00);
      if (uVar6 < uVar5) {
        in_stack_ffffffffffffff94 = 3;
        if (uVar6 == a_00) {
          in_stack_ffffffffffffff94 = 2;
        }
      }
      else {
        in_stack_ffffffffffffff94 = (uint)(uVar5 != a);
      }
      in_stack_ffffffffffffff90 =
           CONCAT13((char)in_stack_ffffffffffffff94,(int3)in_stack_ffffffffffffff90);
      puVar7 = vector<unsigned_char>::operator[]((vector<unsigned_char> *)(in_RDI + 0x960),local_1c)
      ;
      *puVar7 = (uchar)((uint)in_stack_ffffffffffffff90 >> 0x18);
    }
  }
  else {
    puVar7 = vector<unsigned_char>::get_ptr((vector<unsigned_char> *)(in_RDI + 0x960));
    bVar1 = *(byte *)(in_RDI + 0x97b);
    uVar2 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x960));
    memset(puVar7,(uint)bVar1,(ulong)uVar2);
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::compute_selectors_hc() {
  m_best_solution.m_selectors.resize(m_unique_colors.size());
  if (m_best_solution.m_enforce_selector) {
    memset(m_best_solution.m_selectors.get_ptr(), m_best_solution.m_enforced_selector, m_best_solution.m_selectors.size());
    return;
  }
  color_quad_u8 c0 = dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, true);
  color_quad_u8 c1 = dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, true);
  color_quad_u8 c2((c0.r * 2 + c1.r + m_best_solution.m_alternate_rounding) / 3, (c0.g * 2 + c1.g + m_best_solution.m_alternate_rounding) / 3, (c0.b * 2 + c1.b + m_best_solution.m_alternate_rounding) / 3, 0);
  color_quad_u8 c3((c1.r * 2 + c0.r + m_best_solution.m_alternate_rounding) / 3, (c1.g * 2 + c0.g + m_best_solution.m_alternate_rounding) / 3, (c1.b * 2 + c0.b + m_best_solution.m_alternate_rounding) / 3, 0);
  for (uint i = 0, iEnd = m_unique_colors.size(); i < iEnd; i++) {
    const color_quad_u8& c = m_unique_colors[i].m_color;
    uint e0 = color::color_distance(m_perceptual, c, c0, false);
    uint e1 = color::color_distance(m_perceptual, c, c1, false);
    uint e2 = color::color_distance(m_perceptual, c, c2, false);
    uint e3 = color::color_distance(m_perceptual, c, c3, false);
    uint e01 = math::minimum(e0, e1);
    uint e23 = math::minimum(e2, e3);
    m_best_solution.m_selectors[i] = e01 <= e23 ? e01 == e0 ? 0 : 1 : e23 == e2 ? 2 : 3;
  }
}